

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O0

void __thiscall Assimp::Blender::DNAParser::Parse(DNAParser *this)

{
  bool bVar1;
  int16_t iVar2;
  int32_t iVar3;
  uint uVar4;
  int iVar5;
  DeadlyImportError *pDVar6;
  ulong uVar7;
  size_type sVar8;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar9;
  basic_formatter *pbVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  reference pvVar11;
  mapped_type_conflict3 *pmVar12;
  vector<Assimp::Blender::Structure> *this_01;
  vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_> *this_02;
  reference pvVar13;
  char *pcVar14;
  reference pcVar15;
  Logger *this_03;
  size_type local_b38;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  string local_9b8;
  string local_998 [39];
  undefined1 local_971;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  string local_7f8;
  long local_7d8;
  size_type rb;
  undefined1 local_7c1;
  size_type local_7c0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  string local_640;
  reference local_620;
  Field *f;
  size_type sStack_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_608;
  string local_5f8;
  size_t local_5d8;
  size_t sStack_5d0;
  size_t local_5c8;
  size_t sStack_5c0;
  undefined8 local_5b8;
  undefined1 local_5a9;
  size_type local_5a8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  string local_428;
  ushort local_402;
  ulong uStack_400;
  uint16_t j;
  size_t m;
  size_t offset;
  Structure *s_3;
  undefined1 local_369;
  size_type local_368;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_1e8;
  ushort local_1c2;
  size_t sStack_1c0;
  uint16_t n;
  size_t i;
  size_t fields;
  size_t end;
  string local_1a0;
  reference local_180;
  Type *s_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Type,_std::allocator<Type>_> *__range1_2;
  string local_158;
  int8_t local_131;
  reference pTStack_130;
  char c_1;
  Type *s_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Type,_std::allocator<Type>_> *__range1_1;
  undefined1 local_108 [8];
  vector<Type,_std::allocator<Type>_> types;
  string local_e8;
  int8_t local_c1;
  reference pbStack_c0;
  char c;
  string *s;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string local_78;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  DNA *local_20;
  DNA *dna;
  StreamReaderAny *stream;
  DNAParser *this_local;
  
  stream = (StreamReaderAny *)this;
  dna = (DNA *)::std::__shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>::
               get(&(this->db->reader).
                    super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>
                  );
  local_20 = &this->db->dna;
  bVar1 = match4((StreamReaderAny *)dna,"SDNA");
  if (!bVar1) {
    local_55 = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_40,"BlenderDNA: Expected SDNA chunk",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_40);
    local_55 = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  bVar1 = match4((StreamReaderAny *)dna,"NAME");
  if (!bVar1) {
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_78,"BlenderDNA: Expected NAME field",
               (allocator *)
               ((long)&names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    DeadlyImportError::DeadlyImportError(pDVar6,&local_78);
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar3 = StreamReader<true,_true>::GetI4((StreamReader<true,_true> *)dna);
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&__range1 + 7));
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_98,(long)iVar3,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1 + 7));
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&__range1 + 7));
  __end1 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_98);
  s = (string *)
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&s), bVar1) {
    pbStack_c0 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
    while (local_c1 = StreamReader<true,_true>::GetI1((StreamReader<true,_true> *)dna),
          local_c1 != '\0') {
      ::std::__cxx11::string::operator+=((string *)pbStack_c0,local_c1);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  while (uVar4 = StreamReader<true,_true>::GetCurrentPos((StreamReader<true,_true> *)dna),
        (uVar4 & 3) != 0) {
    StreamReader<true,_true>::GetI1((StreamReader<true,_true> *)dna);
  }
  bVar1 = match4((StreamReaderAny *)dna,"TYPE");
  if (!bVar1) {
    types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._6_1_ = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_e8,"BlenderDNA: Expected TYPE field",
               (allocator *)
               ((long)&types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    DeadlyImportError::DeadlyImportError(pDVar6,&local_e8);
    types.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._6_1_ = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar3 = StreamReader<true,_true>::GetI4((StreamReader<true,_true> *)dna);
  ::std::allocator<Type>::allocator((allocator<Type> *)((long)&__range1_1 + 7));
  ::std::vector<Type,_std::allocator<Type>_>::vector
            ((vector<Type,_std::allocator<Type>_> *)local_108,(long)iVar3,
             (allocator<Type> *)((long)&__range1_1 + 7));
  ::std::allocator<Type>::~allocator((allocator<Type> *)((long)&__range1_1 + 7));
  __end1_1 = ::std::vector<Type,_std::allocator<Type>_>::begin
                       ((vector<Type,_std::allocator<Type>_> *)local_108);
  s_1 = (Type *)::std::vector<Type,_std::allocator<Type>_>::end
                          ((vector<Type,_std::allocator<Type>_> *)local_108);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Type_*,_std::vector<Type,_std::allocator<Type>_>_> *)
                            &s_1), bVar1) {
    pTStack_130 = __gnu_cxx::__normal_iterator<Type_*,_std::vector<Type,_std::allocator<Type>_>_>::
                  operator*(&__end1_1);
    while (local_131 = StreamReader<true,_true>::GetI1((StreamReader<true,_true> *)dna),
          local_131 != '\0') {
      ::std::__cxx11::string::operator+=((string *)&pTStack_130->name,local_131);
    }
    __gnu_cxx::__normal_iterator<Type_*,_std::vector<Type,_std::allocator<Type>_>_>::operator++
              (&__end1_1);
  }
  while (uVar4 = StreamReader<true,_true>::GetCurrentPos((StreamReader<true,_true> *)dna),
        (uVar4 & 3) != 0) {
    StreamReader<true,_true>::GetI1((StreamReader<true,_true> *)dna);
  }
  bVar1 = match4((StreamReaderAny *)dna,"TLEN");
  if (!bVar1) {
    __range1_2._6_1_ = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_158,"BlenderDNA: Expected TLEN field",
               (allocator *)((long)&__range1_2 + 7));
    DeadlyImportError::DeadlyImportError(pDVar6,&local_158);
    __range1_2._6_1_ = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  __end1_2 = ::std::vector<Type,_std::allocator<Type>_>::begin
                       ((vector<Type,_std::allocator<Type>_> *)local_108);
  s_2 = (Type *)::std::vector<Type,_std::allocator<Type>_>::end
                          ((vector<Type,_std::allocator<Type>_> *)local_108);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<Type_*,_std::vector<Type,_std::allocator<Type>_>_> *)
                            &s_2), bVar1) {
    local_180 = __gnu_cxx::__normal_iterator<Type_*,_std::vector<Type,_std::allocator<Type>_>_>::
                operator*(&__end1_2);
    iVar2 = StreamReader<true,_true>::GetI2((StreamReader<true,_true> *)dna);
    local_180->size = (long)iVar2;
    __gnu_cxx::__normal_iterator<Type_*,_std::vector<Type,_std::allocator<Type>_>_>::operator++
              (&__end1_2);
  }
  while (uVar4 = StreamReader<true,_true>::GetCurrentPos((StreamReader<true,_true> *)dna),
        (uVar4 & 3) != 0) {
    StreamReader<true,_true>::GetI1((StreamReader<true,_true> *)dna);
  }
  bVar1 = match4((StreamReaderAny *)dna,"STRC");
  if (!bVar1) {
    end._6_1_ = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_1a0,"BlenderDNA: Expected STRC field",(allocator *)((long)&end + 7))
    ;
    DeadlyImportError::DeadlyImportError(pDVar6,&local_1a0);
    end._6_1_ = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar3 = StreamReader<true,_true>::GetI4((StreamReader<true,_true> *)dna);
  fields = (size_t)iVar3;
  i = 0;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::reserve
            (&(local_20->structures).
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             fields);
  sStack_1c0 = 0;
  do {
    if (sStack_1c0 == fields) {
      this_03 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[17]>(&local_b30,(char (*) [17])"BlenderDNA: Got ");
      local_b38 = ::std::
                  vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
                  size(&(local_20->structures).
                        super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      );
      pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_b30,&local_b38);
      pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar9,(char (*) [26])" structures with totally ");
      pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar9,&i);
      pbVar10 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar9,(char (*) [8])" fields");
      Formatter::basic_formatter::operator_cast_to_string(&local_9b8,pbVar10);
      Logger::debug(this_03,&local_9b8);
      ::std::__cxx11::string::~string((string *)&local_9b8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_b30);
      DNA::DumpToFile(local_20);
      DNA::AddPrimitiveStructures(local_20);
      DNA::RegisterConverters(local_20);
      ::std::vector<Type,_std::allocator<Type>_>::~vector
                ((vector<Type,_std::allocator<Type>_> *)local_108);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
      return;
    }
    local_1c2 = StreamReader<true,_true>::GetI2((StreamReader<true,_true> *)dna);
    uVar7 = (ulong)local_1c2;
    sVar8 = ::std::vector<Type,_std::allocator<Type>_>::size
                      ((vector<Type,_std::allocator<Type>_> *)local_108);
    if (sVar8 <= uVar7) {
      local_369 = 1;
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter(&local_360);
      pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_360,
                         (char (*) [49])"BlenderDNA: Invalid type index in structure name");
      pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar9,&local_1c2);
      pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar9,(char (*) [18])" (there are only ");
      local_368 = ::std::vector<Type,_std::allocator<Type>_>::size
                            ((vector<Type,_std::allocator<Type>_> *)local_108);
      pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar9,&local_368);
      pbVar10 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar9,(char (*) [10])" entries)");
      Formatter::basic_formatter::operator_cast_to_string(&local_1e8,pbVar10);
      DeadlyImportError::DeadlyImportError(pDVar6,&local_1e8);
      local_369 = 0;
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    sVar8 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
            size(&(local_20->structures).
                  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                );
    this_00 = &local_20->indices;
    pvVar11 = ::std::vector<Type,_std::allocator<Type>_>::operator[]
                        ((vector<Type,_std::allocator<Type>_> *)local_108,(ulong)local_1c2);
    pmVar12 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::operator[](this_00,&pvVar11->name);
    *pmVar12 = sVar8;
    this_01 = &local_20->structures;
    Structure::Structure((Structure *)&s_3);
    ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
    push_back(&this_01->
               super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
              ,(value_type *)&s_3);
    Structure::~Structure((Structure *)&s_3);
    offset = (size_t)::std::
                     vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                     ::back(&(local_20->structures).
                             super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                           );
    pvVar11 = ::std::vector<Type,_std::allocator<Type>_>::operator[]
                        ((vector<Type,_std::allocator<Type>_> *)local_108,(ulong)local_1c2);
    ::std::__cxx11::string::operator=((string *)offset,(string *)&pvVar11->name);
    local_1c2 = StreamReader<true,_true>::GetI2((StreamReader<true,_true> *)dna);
    ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::reserve
              ((vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_> *)
               (offset + 0x20),(ulong)local_1c2);
    m = 0;
    for (uStack_400 = 0; uStack_400 < local_1c2; uStack_400 = uStack_400 + 1) {
      local_402 = StreamReader<true,_true>::GetI2((StreamReader<true,_true> *)dna);
      uVar7 = (ulong)local_402;
      sVar8 = ::std::vector<Type,_std::allocator<Type>_>::size
                        ((vector<Type,_std::allocator<Type>_> *)local_108);
      if (sVar8 <= uVar7) {
        local_5a9 = 1;
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter(&local_5a0);
        pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_5a0,
                           (char (*) [51])"BlenderDNA: Invalid type index in structure field ");
        pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar9,&local_402);
        pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar9,(char (*) [18])" (there are only ");
        local_5a8 = ::std::vector<Type,_std::allocator<Type>_>::size
                              ((vector<Type,_std::allocator<Type>_> *)local_108);
        pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar9,&local_5a8);
        pbVar10 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar9,(char (*) [10])" entries)");
        Formatter::basic_formatter::operator_cast_to_string(&local_428,pbVar10);
        DeadlyImportError::DeadlyImportError(pDVar6,&local_428);
        local_5a9 = 0;
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      this_02 = (vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_> *)
                (offset + 0x20);
      local_5c8 = 0;
      sStack_5c0 = 0;
      local_5d8 = 0;
      sStack_5d0 = 0;
      local_5f8.field_2._M_allocated_capacity = 0;
      local_5f8.field_2._8_8_ = 0;
      local_5f8._M_dataplus = (_Alloc_hider)0x0;
      local_5f8._1_7_ = 0;
      local_5f8._M_string_length = 0;
      local_608._M_allocated_capacity = 0;
      local_608._8_8_ = 0;
      f = (Field *)0x0;
      sStack_610 = 0;
      local_5b8._0_4_ = 0;
      local_5b8._4_4_ = 0;
      Field::Field((Field *)&f);
      ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::push_back
                (this_02,(Field *)&f);
      Field::~Field((Field *)&f);
      local_620 = ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::
                  back((vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_> *)
                       (offset + 0x20));
      local_620->offset = m;
      pvVar11 = ::std::vector<Type,_std::allocator<Type>_>::operator[]
                          ((vector<Type,_std::allocator<Type>_> *)local_108,(ulong)local_402);
      ::std::__cxx11::string::operator=((string *)&local_620->type,(string *)&pvVar11->name);
      pvVar11 = ::std::vector<Type,_std::allocator<Type>_>::operator[]
                          ((vector<Type,_std::allocator<Type>_> *)local_108,(ulong)local_402);
      local_620->size = pvVar11->size;
      local_402 = StreamReader<true,_true>::GetI2((StreamReader<true,_true> *)dna);
      uVar7 = (ulong)local_402;
      sVar8 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_98);
      if (sVar8 <= uVar7) {
        local_7c1 = 1;
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter(&local_7b8);
        pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_7b8,
                           (char (*) [51])"BlenderDNA: Invalid name index in structure field ");
        pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar9,&local_402);
        pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar9,(char (*) [18])" (there are only ");
        local_7c0 = ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_98);
        pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar9,&local_7c0);
        pbVar10 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar9,(char (*) [10])" entries)");
        Formatter::basic_formatter::operator_cast_to_string(&local_640,pbVar10);
        DeadlyImportError::DeadlyImportError(pDVar6,&local_640);
        local_7c1 = 0;
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      pvVar13 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_98,(ulong)local_402);
      ::std::__cxx11::string::operator=((string *)local_620,(string *)pvVar13);
      local_620->flags = 0;
      pcVar14 = (char *)::std::__cxx11::string::operator[]((ulong)local_620);
      if (*pcVar14 == '*') {
        iVar5 = 4;
        if ((this->db->i64bit & 1U) != 0) {
          iVar5 = 8;
        }
        local_620->size = (long)iVar5;
        local_620->flags = local_620->flags | 1;
      }
      ::std::__cxx11::string::rbegin();
      pcVar15 = ::std::
                reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&rb);
      if (*pcVar15 == ']') {
        local_7d8 = ::std::__cxx11::string::find((char)local_620,0x5b);
        if (local_7d8 == -1) {
          local_971 = 1;
          pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter(&local_970);
          pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_970,
                             (char (*) [51])"BlenderDNA: Encountered invalid array declaration ");
          pbVar10 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_(pbVar9,&local_620->name);
          Formatter::basic_formatter::operator_cast_to_string(&local_7f8,pbVar10);
          DeadlyImportError::DeadlyImportError(pDVar6,&local_7f8);
          local_971 = 0;
          __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        local_620->flags = local_620->flags | 2;
        DNA::ExtractArraySize(&local_620->name,local_620->array_sizes);
        ::std::__cxx11::string::substr((ulong)local_998,(ulong)local_620);
        ::std::__cxx11::string::operator=((string *)local_620,local_998);
        ::std::__cxx11::string::~string(local_998);
        local_620->size = local_620->array_sizes[0] * local_620->array_sizes[1] * local_620->size;
      }
      sVar8 = ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::size
                        ((vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_> *)
                         (offset + 0x20));
      pmVar12 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                              *)(offset + 0x38),&local_620->name);
      *pmVar12 = sVar8 - 1;
      m = local_620->size + m;
      i = i + 1;
    }
    *(size_t *)(offset + 0x68) = m;
    sStack_1c0 = sStack_1c0 + 1;
  } while( true );
}

Assistant:

void DNAParser::Parse ()
{
    StreamReaderAny& stream = *db.reader.get();
    DNA& dna = db.dna;

    if(!match4(stream,"SDNA")) {
        throw DeadlyImportError("BlenderDNA: Expected SDNA chunk");
    }

    // name dictionary
    if(!match4(stream,"NAME")) {
        throw DeadlyImportError("BlenderDNA: Expected NAME field");
    }

    std::vector<std::string> names (stream.GetI4());
    for(std::string& s : names) {
        while (char c = stream.GetI1()) {
            s += c;
        }
    }

    // type dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"TYPE")) {
        throw DeadlyImportError("BlenderDNA: Expected TYPE field");
    }

    std::vector<Type> types (stream.GetI4());
    for(Type& s : types) {
        while (char c = stream.GetI1()) {
            s.name += c;
        }
    }

    // type length dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"TLEN")) {
        throw DeadlyImportError("BlenderDNA: Expected TLEN field");
    }

    for(Type& s : types) {
        s.size = stream.GetI2();
    }

    // structures dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"STRC")) {
        throw DeadlyImportError("BlenderDNA: Expected STRC field");
    }

    size_t end = stream.GetI4(), fields = 0;

    dna.structures.reserve(end);
    for(size_t i = 0; i != end; ++i) {

        uint16_t n = stream.GetI2();
        if (n >= types.size()) {
            throw DeadlyImportError((format(),
                "BlenderDNA: Invalid type index in structure name" ,n,
                " (there are only ", types.size(), " entries)"
            ));
        }

        // maintain separate indexes
        dna.indices[types[n].name] = dna.structures.size();

        dna.structures.push_back(Structure());
        Structure& s = dna.structures.back();
        s.name  = types[n].name;
        //s.index = dna.structures.size()-1;

        n = stream.GetI2();
        s.fields.reserve(n);

        size_t offset = 0;
        for (size_t m = 0; m < n; ++m, ++fields) {

            uint16_t j = stream.GetI2();
            if (j >= types.size()) {
                throw DeadlyImportError((format(),
                    "BlenderDNA: Invalid type index in structure field ", j,
                    " (there are only ", types.size(), " entries)"
                ));
            }
            s.fields.push_back(Field());
            Field& f = s.fields.back();
            f.offset = offset;

            f.type = types[j].name;
            f.size = types[j].size;

            j = stream.GetI2();
            if (j >= names.size()) {
                throw DeadlyImportError((format(),
                    "BlenderDNA: Invalid name index in structure field ", j,
                    " (there are only ", names.size(), " entries)"
                ));
            }

            f.name = names[j];
            f.flags = 0u;

            // pointers always specify the size of the pointee instead of their own.
            // The pointer asterisk remains a property of the lookup name.
            if (f.name[0] == '*') {
                f.size = db.i64bit ? 8 : 4;
                f.flags |= FieldFlag_Pointer;
            }

            // arrays, however, specify the size of a single element so we
            // need to parse the (possibly multi-dimensional) array declaration
            // in order to obtain the actual size of the array in the file.
            // Also we need to alter the lookup name to include no array
            // brackets anymore or size fixup won't work (if our size does
            // not match the size read from the DNA).
            if (*f.name.rbegin() == ']') {
                const std::string::size_type rb = f.name.find('[');
                if (rb == std::string::npos) {
                    throw DeadlyImportError((format(),
                        "BlenderDNA: Encountered invalid array declaration ",
                        f.name
                    ));
                }

                f.flags |= FieldFlag_Array;
                DNA::ExtractArraySize(f.name,f.array_sizes);
                f.name = f.name.substr(0,rb);

                f.size *= f.array_sizes[0] * f.array_sizes[1];
            }

            // maintain separate indexes
            s.indices[f.name] = s.fields.size()-1;
            offset += f.size;
        }
        s.size = offset;
    }

    ASSIMP_LOG_DEBUG_F( "BlenderDNA: Got ", dna.structures.size()," structures with totally ",fields," fields");

#ifdef ASSIMP_BUILD_BLENDER_DEBUG
    dna.DumpToFile();
#endif

    dna.AddPrimitiveStructures();
    dna.RegisterConverters();
}